

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O3

int __thiscall
CVmObjIterIdx::getp_is_next_avail(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  int iVar2;
  
  if (getp_is_next_avail(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_is_next_avail();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,argc,&getp_is_next_avail::desc);
  if (iVar2 == 0) {
    pcVar1 = (this->super_CVmObjIter).super_CVmObject.ext_;
    retval->typ = (*(uint *)(pcVar1 + 5) < *(uint *)(pcVar1 + 0xd)) + VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_is_next_avail(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                      uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   if the current index plus one is less than or equal to the last
     *   valid index, another item is available 
     */
    retval->set_logical(get_cur_index() + 1 <= get_last_valid());

    /* handled */
    return TRUE;
}